

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByNumber
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  DescriptorPool *pDVar4;
  MutexLockMaybe local_338;
  MutexLockMaybe lock_1;
  DeferredValidation deferred_validation;
  FieldDescriptor *result;
  FieldDescriptor *result_1;
  ReaderMutexLock lock;
  int number_local;
  Descriptor *extendee_local;
  DescriptorPool *this_local;
  
  lock.mu_._4_4_ = number;
  iVar2 = Descriptor::extension_range_count(extendee);
  if (iVar2 == 0) {
    this_local = (DescriptorPool *)0x0;
  }
  else {
    if (this->mutex_ != (Mutex *)0x0) {
      absl::lts_20250127::ReaderMutexLock::ReaderMutexLock
                ((ReaderMutexLock *)&result_1,this->mutex_);
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      pDVar4 = (DescriptorPool *)Tables::FindExtension(pTVar3,extendee,lock.mu_._4_4_);
      if (pDVar4 != (DescriptorPool *)0x0) {
        this_local = pDVar4;
      }
      absl::lts_20250127::ReaderMutexLock::~ReaderMutexLock((ReaderMutexLock *)&result_1);
      if (pDVar4 != (DescriptorPool *)0x0) {
        return (FieldDescriptor *)this_local;
      }
    }
    DeferredValidation::DeferredValidation((DeferredValidation *)&lock_1,this);
    absl::lts_20250127::MutexLockMaybe::MutexLockMaybe(&local_338,this->mutex_);
    if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(pTVar3->known_bad_symbols_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(pTVar3->known_bad_files_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    }
    pTVar3 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    deferred_validation.lifetimes_info_map_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.slot_array =
         (MaybeInitializedPtr)Tables::FindExtension(pTVar3,extendee,lock.mu_._4_4_);
    if (deferred_validation.lifetimes_info_map_.
        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
        .
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        heap_or_soo_.heap.slot_array.p == (MaybeInitializedPtr)0x0) {
      if ((this->underlay_ == (DescriptorPool *)0x0) ||
         (deferred_validation.lifetimes_info_map_.
          super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
          .
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          heap_or_soo_.heap.slot_array =
               (MaybeInitializedPtr)FindExtensionByNumber(this->underlay_,extendee,lock.mu_._4_4_),
         deferred_validation.lifetimes_info_map_.
         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
         .
         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
         .settings_.
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         heap_or_soo_.heap.slot_array.p == (MaybeInitializedPtr)0x0)) {
        bVar1 = TryFindExtensionInFallbackDatabase
                          (this,extendee,lock.mu_._4_4_,(DeferredValidation *)&lock_1);
        if (bVar1) {
          pTVar3 = std::
                   unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ::operator->(&this->tables_);
          deferred_validation.lifetimes_info_map_.
          super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
          .
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          heap_or_soo_.heap.slot_array =
               (MaybeInitializedPtr)Tables::FindExtension(pTVar3,extendee,lock.mu_._4_4_);
        }
        bVar1 = false;
      }
      else {
        bVar1 = true;
        this_local = (DescriptorPool *)
                     deferred_validation.lifetimes_info_map_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.slot_array;
      }
    }
    else {
      bVar1 = true;
      this_local = (DescriptorPool *)
                   deferred_validation.lifetimes_info_map_.
                   super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                   .
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.slot_array;
    }
    absl::lts_20250127::MutexLockMaybe::~MutexLockMaybe(&local_338);
    if (!bVar1) {
      bVar1 = DeferredValidation::Validate((DeferredValidation *)&lock_1);
      if (bVar1) {
        this_local = (DescriptorPool *)
                     deferred_validation.lifetimes_info_map_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.slot_array;
      }
      else {
        this_local = (DescriptorPool *)0x0;
      }
    }
    DeferredValidation::~DeferredValidation((DeferredValidation *)&lock_1);
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByNumber(
    const Descriptor* extendee, int number) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  // A faster path to reduce lock contention in finding extensions, assuming
  // most extensions will be cache hit.
  if (mutex_ != nullptr) {
    absl::ReaderMutexLock lock(mutex_);
    const FieldDescriptor* result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  const FieldDescriptor* result = nullptr;
  DeferredValidation deferred_validation(this);
  {
    absl::MutexLockMaybe lock(mutex_);
    if (fallback_database_ != nullptr) {
      tables_->known_bad_symbols_.clear();
      tables_->known_bad_files_.clear();
    }
    result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
    if (underlay_ != nullptr) {
      result = underlay_->FindExtensionByNumber(extendee, number);
      if (result != nullptr) return result;
    }
    if (TryFindExtensionInFallbackDatabase(extendee, number,
                                           deferred_validation)) {
      result = tables_->FindExtension(extendee, number);
    }
  }
  if (!deferred_validation.Validate()) {
    return nullptr;
  }
  return result;
}